

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_bson.hpp
# Opt level: O1

type jsoncons::bson::
     encode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j,ostream *os,
               bson_encode_options *options)

{
  pointer puVar1;
  pointer __s;
  value_type_conflict *__val;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  adaptor;
  bson_stream_encoder encoder;
  binary_stream_sink local_100;
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> local_c8;
  
  local_100.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.stream_ptr_ = os;
  __s = (pointer)operator_new(0x4000);
  puVar1 = __s + 0x4000;
  local_100.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  local_100.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __s;
  local_100.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1;
  memset(__s,0,0x4000);
  local_c8.super_basic_json_visitor<char>._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_bson_encoder_00b5a508;
  local_c8.sink_.stream_ptr_ = local_100.stream_ptr_;
  local_100.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.options_._16_4_ =
       *(undefined4 *)(&options->field_0x8 + (long)options->_vptr_bson_encode_options[-3]);
  local_c8.options_._vptr_bson_encode_options = (_func_int **)(bson_encode_options::vtable + 0x18);
  local_c8.options_._8_8_ = 0xb59388;
  local_c8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.stack_.
  super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.stack_.
  super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.stack_.
  super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.nesting_depth_ = 0;
  local_100.begin_buffer_ = __s;
  local_100.end_buffer_ = puVar1;
  local_100.p_ = __s;
  local_c8.sink_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  local_c8.sink_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  local_c8.sink_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1;
  local_c8.sink_.begin_buffer_ = __s;
  local_c8.sink_.end_buffer_ = puVar1;
  local_c8.sink_.p_ = __s;
  binary_stream_sink::~binary_stream_sink(&local_100);
  local_100.stream_ptr_ =
       (basic_ostream<char,_std::char_traits<char>_> *)&PTR__basic_json_visitor_00b5b348;
  local_100.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_c8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            (j,(basic_json_visitor<char> *)&local_100);
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::~basic_bson_encoder
            (&local_c8);
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,void>::type 
    encode_bson(const T& j, 
                std::ostream& os, 
                const bson_encode_options& options = bson_encode_options())
    {
        using char_type = typename T::char_type;
        bson_stream_encoder encoder(os, options);
        auto adaptor = make_json_visitor_adaptor<basic_json_visitor<char_type>>(encoder);
        j.dump(adaptor);
    }